

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::LinearDerivateCase::~LinearDerivateCase(LinearDerivateCase *this)

{
  LinearDerivateCase *this_local;
  
  (this->super_TriangleDerivateCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__LinearDerivateCase_032af7b0;
  std::__cxx11::string::~string((string *)&this->m_fragmentTmpl);
  TriangleDerivateCase::~TriangleDerivateCase(&this->super_TriangleDerivateCase);
  return;
}

Assistant:

~LinearDerivateCase		(void) {}